

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

ByteArray * __thiscall
EncodingTable::encodeString
          (ByteArray *__return_storage_ptr__,EncodingTable *this,string *str,bool writeTermination)

{
  bool bVar1;
  size_t i_1;
  ulong uVar2;
  pointer pTVar3;
  size_t i;
  ulong uVar4;
  size_t index;
  ByteArray result;
  size_t local_50;
  ByteArray local_48;
  
  ByteArray::ByteArray(&local_48);
  uVar2 = 0;
  do {
    if (str->_M_string_length <= uVar2) {
      if (writeTermination) {
        for (uVar2 = 0; uVar2 < (this->terminationEntry).hexLen; uVar2 = uVar2 + 1) {
          ByteArray::appendByte
                    (&local_48,(this->hexData).data_[uVar2 + (this->terminationEntry).hexPos]);
        }
      }
      ByteArray::ByteArray(__return_storage_ptr__,&local_48);
LAB_00147527:
      ByteArray::~ByteArray(&local_48);
      return __return_storage_ptr__;
    }
    bVar1 = Trie::findLongestPrefix(&this->lookup,(str->_M_dataplus)._M_p + uVar2,&local_50);
    if (!bVar1) {
      ByteArray::ByteArray(__return_storage_ptr__);
      goto LAB_00147527;
    }
    pTVar3 = (this->entries).
             super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
             ._M_impl.super__Vector_impl_data._M_start + local_50;
    for (uVar4 = 0; uVar4 < pTVar3->hexLen; uVar4 = uVar4 + 1) {
      ByteArray::appendByte(&local_48,(this->hexData).data_[uVar4 + pTVar3->hexPos]);
    }
    uVar2 = uVar2 + pTVar3->valueLen;
  } while( true );
}

Assistant:

ByteArray EncodingTable::encodeString(const std::string& str, bool writeTermination)
{
	ByteArray result;

	size_t pos = 0;
	while (pos < str.size())
	{
		size_t index;
		if (!lookup.findLongestPrefix(str.c_str()+pos,index))
		{
			// error
			return ByteArray();
		}

		TableEntry& entry = entries[index];
		for (size_t i = 0; i < entry.hexLen; i++)
		{
			result.appendByte(hexData[entry.hexPos+i]);
		}

		pos += entry.valueLen;
	}

	if (writeTermination)
	{
		TableEntry& entry = terminationEntry;
		for (size_t i = 0; i < entry.hexLen; i++)
		{
			result.appendByte(hexData[entry.hexPos+i]);
		}
	}

	return result;
}